

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

Signedness __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::Visit(IsGreaterThanZero *this,SENode *node)

{
  SENode *node_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Combiner local_60;
  Combiner local_40;
  SENode *local_20;
  SENode *node_local;
  IsGreaterThanZero *this_local;
  
  local_20 = node;
  node_local = (SENode *)this;
  iVar1 = (**node->_vptr_SENode)();
  node_00 = local_20;
  switch(iVar1) {
  case 0:
    iVar1 = (*local_20->_vptr_SENode[5])();
    this_local._4_4_ = Visit(this,(SEConstantNode *)CONCAT44(extraout_var,iVar1));
    break;
  case 1:
    iVar1 = (*local_20->_vptr_SENode[7])();
    this_local._4_4_ = Visit(this,(SERecurrentNode *)CONCAT44(extraout_var_00,iVar1));
    break;
  case 2:
    GetAddCombiner(&local_40,this);
    this_local._4_4_ = VisitExpr(this,node_00,&local_40);
    std::
    function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
    ::~function(&local_40);
    break;
  case 3:
    GetMulCombiner(&local_60,this);
    this_local._4_4_ = VisitExpr(this,node_00,&local_60);
    std::
    function<spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness_(spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness,_spvtools::opt::(anonymous_namespace)::IsGreaterThanZero::Signedness)>
    ::~function(&local_60);
    break;
  case 4:
    iVar1 = (*local_20->_vptr_SENode[0xd])();
    this_local._4_4_ = Visit(this,(SENegative *)CONCAT44(extraout_var_01,iVar1));
    break;
  case 5:
    iVar1 = (*local_20->_vptr_SENode[0xf])();
    this_local._4_4_ = Visit(this,(SEValueUnknown *)CONCAT44(extraout_var_03,iVar1));
    break;
  case 6:
    iVar1 = (*local_20->_vptr_SENode[0x11])();
    this_local._4_4_ = Visit(this,(SECantCompute *)CONCAT44(extraout_var_02,iVar1));
    break;
  default:
    this_local._4_4_ = kPositiveOrNegative;
  }
  return this_local._4_4_;
}

Assistant:

Signedness Visit(const SENode* node) {
    switch (node->GetType()) {
      case SENode::Constant:
        return Visit(node->AsSEConstantNode());
        break;
      case SENode::RecurrentAddExpr:
        return Visit(node->AsSERecurrentNode());
        break;
      case SENode::Negative:
        return Visit(node->AsSENegative());
        break;
      case SENode::CanNotCompute:
        return Visit(node->AsSECantCompute());
        break;
      case SENode::ValueUnknown:
        return Visit(node->AsSEValueUnknown());
        break;
      case SENode::Add:
        return VisitExpr(node, GetAddCombiner());
        break;
      case SENode::Multiply:
        return VisitExpr(node, GetMulCombiner());
        break;
    }
    return Signedness::kPositiveOrNegative;
  }